

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_powroot_Test::TestBody(fixedPreciseMeasurement_powroot_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  double __x;
  double __x_00;
  double __x_01;
  double in_XMM1_Qa;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198;
  fixed_precise_measurement local_190;
  fixed_precise_measurement local_178;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  undefined1 local_138 [8];
  fixed_precise_measurement m4;
  AssertHelper local_100;
  Message local_f8;
  bool local_e9;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_;
  fixed_precise_measurement m2;
  Message local_b8;
  precise_unit local_b0;
  precise_unit local_a0;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  double local_60;
  double local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  fixed_precise_measurement v1;
  fixed_precise_measurement m1;
  fixedPreciseMeasurement_powroot_Test *this_local;
  
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)&v1.units_.base_units_,2.0,
             (precise_unit *)units::precise::m);
  units::pow(__x,in_XMM1_Qa);
  local_58 = units::fixed_precise_measurement::value
                       ((fixed_precise_measurement *)&gtest_ar.message_);
  local_60 = 8.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_50,"v1.value()","8.0",&local_58,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x381,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  local_a0 = units::fixed_precise_measurement::units
                       ((fixed_precise_measurement *)&gtest_ar.message_);
  local_b0.multiplier_ =
       units::precise_unit::pow((precise_unit *)units::precise::m,local_a0.multiplier_,in_XMM1_Qa);
  testing::internal::EqHelper::Compare<units::precise_unit,_units::precise_unit,_nullptr>
            ((EqHelper *)local_90,"v1.units()","precise::m.pow(3)",&local_a0,&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&m2.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x382,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&m2.units_.base_units_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&m2.units_.base_units_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  units::root((fixed_precise_measurement *)&gtest_ar_.message_,
              (fixed_precise_measurement *)&gtest_ar.message_,3);
  local_e9 = units::fixed_precise_measurement::operator==
                       ((fixed_precise_measurement *)&gtest_ar_.message_,
                        (fixed_precise_measurement *)&v1.units_.base_units_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_e8,&local_e9,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&m4.units_.base_units_,(internal *)local_e8,(AssertionResult *)"m2 == m1",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x385,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&m4.units_.base_units_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )units::precise_unit::pow((precise_unit *)units::precise::m,__x_00,in_XMM1_Qa);
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)local_138,16.0,(precise_unit *)&gtest_ar__1.message_);
  units::sqrt((units *)&local_178,__x_01);
  units::fixed_precise_measurement::fixed_precise_measurement
            (&local_190,4.0,(precise_unit *)units::precise::m);
  local_159 = units::fixed_precise_measurement::operator==(&local_178,&local_190);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c0,(internal *)local_158,
               (AssertionResult *)"sqrt(m4) == fixed_precise_measurement(4.0, precise::m)","false",
               "true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement.cpp"
               ,0x388,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, powroot)
{
    fixed_precise_measurement m1(2.0, precise::m);

    auto v1 = pow(m1, 3);
    EXPECT_EQ(v1.value(), 8.0);
    EXPECT_EQ(v1.units(), precise::m.pow(3));
#ifndef UNITS_HEADER_ONLY
    auto m2 = root(v1, 3);
    EXPECT_TRUE(m2 == m1);

    fixed_precise_measurement m4(16.0, precise::m.pow(2));
    EXPECT_TRUE(sqrt(m4) == fixed_precise_measurement(4.0, precise::m));
#endif
}